

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O2

void __thiscall
t_st_generator::st_class_method
          (t_st_generator *this,ostream *out,string *cls,string *name,string *category)

{
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)cls);
  std::__cxx11::string::string((string *)&local_60,(string *)name);
  std::__cxx11::string::string((string *)&local_80,(string *)category);
  st_method(this,out,&local_40,&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void t_st_generator::st_class_method(std::ostream& out, string cls, string name, string category) {
  st_method(out, cls, name, category);
}